

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O3

void __thiscall duckdb::BaseSecret::SerializeBaseSecret(BaseSecret *this,Serializer *serializer)

{
  pointer pbVar1;
  pointer pbVar2;
  const_reference pvVar3;
  size_type __n;
  size_type sVar4;
  
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&this->type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"provider");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&this->provider);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"name");
  (*serializer->_vptr_Serializer[0x1c])(serializer,&this->name);
  (*serializer->_vptr_Serializer[3])(serializer);
  pbVar1 = (this->prefix_paths).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->prefix_paths).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar4 = (long)pbVar1 - (long)pbVar2 >> 5;
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"scope");
  (*serializer->_vptr_Serializer[8])(serializer,sVar4);
  if (pbVar1 != pbVar2) {
    __n = 0;
    do {
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&this->prefix_paths,__n);
      (*serializer->_vptr_Serializer[0x1c])(serializer,pvVar3);
      __n = __n + 1;
    } while (sVar4 != __n);
  }
  (*serializer->_vptr_Serializer[9])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BaseSecret::SerializeBaseSecret(Serializer &serializer) const {
	serializer.WriteProperty(100, "type", type);
	serializer.WriteProperty(101, "provider", provider);
	serializer.WriteProperty(102, "name", name);
	serializer.WriteList(103, "scope", prefix_paths.size(),
	                     [&](Serializer::List &list, idx_t i) { list.WriteElement(prefix_paths[i]); });
}